

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ScaleProgram::draw
          (ScaleProgram *this,GLuint vao,GLfloat scale,bool tf,Surface *dst)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  Rectangle viewport;
  Random rnd;
  Rectangle local_50;
  deRandom local_40;
  long lVar3;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  deRandom_init(&local_40,vao);
  local_50 = deqp::gls::LifetimeTests::details::randomViewport
                       (this->m_renderCtx,0x80,0x80,(Random *)&local_40);
  deqp::gls::LifetimeTests::details::setViewport(this->m_renderCtx,&local_50);
  (**(code **)(lVar3 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar3 + 0x188))(0x4100);
  (**(code **)(lVar3 + 0xd8))(vao);
  (**(code **)(lVar3 + 0x610))(this->m_posLoc);
  (**(code **)(lVar3 + 0x1680))((this->super_ShaderProgram).m_program.m_program);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"gl.useProgram(getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                  ,0x8b);
  (**(code **)(lVar3 + 0x14e0))(scale,this->m_scaleLoc);
  if ((int)CONCAT71(in_register_00000011,tf) == 0) {
    (**(code **)(lVar3 + 0x538))(4,0,3);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"gl.drawArrays(GL_TRIANGLES, 0, 3)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                    ,0x91);
  }
  else {
    (**(code **)(lVar3 + 0x30))();
    (**(code **)(lVar3 + 0x538))(4,0,3);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"gl.drawArrays(GL_TRIANGLES, 0, 3)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                    ,0x91);
    (**(code **)(lVar3 + 0x638))();
  }
  if (dst != (Surface *)0x0) {
    deqp::gls::LifetimeTests::details::readRectangle(this->m_renderCtx,&local_50,dst);
  }
  (**(code **)(lVar3 + 0xd8))(0);
  return;
}

Assistant:

void ScaleProgram::draw (GLuint vao, GLfloat scale, bool tf, Surface* dst)
{
	const Functions&	gl			= m_renderCtx.getFunctions();
	de::Random			rnd			(vao);
	Rectangle			viewport	= randomViewport(m_renderCtx,
													 VIEWPORT_SIZE, VIEWPORT_SIZE, rnd);
	setViewport(m_renderCtx, viewport);
	gl.clearColor(0, 0, 0, 1);
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

	gl.bindVertexArray(vao);
	gl.enableVertexAttribArray(m_posLoc);
	GLU_CHECK_CALL_ERROR(gl.useProgram(getProgram()),
						 gl.getError());

	gl.uniform1f(m_scaleLoc, scale);

	if (tf)
		gl.beginTransformFeedback(GL_TRIANGLES);
	GLU_CHECK_CALL_ERROR(gl.drawArrays(GL_TRIANGLES, 0, 3), gl.getError());
	if (tf)
		gl.endTransformFeedback();

	if (dst != DE_NULL)
		readRectangle(m_renderCtx, viewport, *dst);

	gl.bindVertexArray(0);
}